

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,IfStmt *stmt)

{
  uint64_t uVar1;
  void *local_48;
  string var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)((long)&var.field_2 + 8),
             &(stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)var.field_2._8_8_ + 0xf8))(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  uVar1 = hash_64_fnv1a(local_48,(uint64_t)var._M_dataplus._M_p);
  var.field_2._8_8_ = uVar1 << ((byte)(this->super_IRVisitor).level & 0x3f) ^ 0x3c6ef372fe94f82d;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,(unsigned_long *)(var.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void visit(IfStmt* stmt) override {
        // magic number comes from here https://stackoverflow.com/a/4948967
        // based on the requirements, warped shifting doesn't matter since it keeps
        // the number of 0 and 1 the same. And I don't think the shifting will
        // introduce any correlation either
        constexpr uint64_t if_signature = shift_const(0x9e3779b97f4a7c16, 1);
        auto var = stmt->predicate()->to_string();
        uint64_t hash = hash_64_fnv1a(var.c_str(), var.size()) << level;
        stmt_hashes_.emplace_back(if_signature ^ hash);
    }